

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCylinder>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomCylinder *cylinder,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  uint uVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string *psVar7;
  int iVar8;
  allocator local_2ed;
  uint local_2ec;
  string *local_2e8;
  Property *local_2e0;
  _Base_ptr local_2d8;
  TypedAttributeWithFallback<tinyusdz::Axis> *local_2d0;
  string *local_2c8;
  ParseResult ret;
  string local_278;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  _Any_data local_228;
  code *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ostringstream ss_e;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&cylinder->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar2) {
    p_Var6 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d0 = &cylinder->axis;
    local_2e8 = err;
    local_2c8 = warn;
    while( true ) {
      name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e;
      bVar2 = (_Rb_tree_header *)p_Var6 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      err = (string *)CONCAT71((int7)((ulong)err >> 8),bVar2);
      if (bVar2) break;
      __lhs = p_Var6 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
      local_2d8 = p_Var6;
      ::std::__cxx11::string::string((string *)name,"radius",(allocator *)&local_278);
      local_2e0 = (Property *)(p_Var6 + 2);
      anon_unknown_0::ParseTypedAttribute<double>
                (&ret,&table,&local_50,(Property *)(p_Var6 + 2),name,&cylinder->radius);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar8 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar2 = false;
        iVar8 = 3;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          local_2ec = (uint)err;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xdca);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_208,"Parsing attribute `{}` failed. Error: {}",&local_2ed);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_278,(fmt *)&local_208,(string *)0x2e7cc2,(char (*) [7])&ret.err,name);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_278);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar7 = local_2e8;
          if (local_2e8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_278,&local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar7);
            ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_278);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
          iVar8 = 1;
          err = (string *)(ulong)local_2ec;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
        psVar7 = (string *)&ss_e;
        ::std::__cxx11::string::string((string *)psVar7,"height",(allocator *)&local_278);
        anon_unknown_0::ParseTypedAttribute<double>
                  (&ret,&table,&local_70,local_2e0,psVar7,&cylinder->height);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar8 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            local_2ec = (uint)err;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xdcc);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_208,"Parsing attribute `{}` failed. Error: {}",&local_2ed);
            fmt::format<char[7],std::__cxx11::string>
                      (&local_278,(fmt *)&local_208,(string *)0x2e7cf5,(char (*) [7])&ret.err,psVar7
                      );
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_278);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar7 = local_2e8;
            if (local_2e8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_278,&local_208,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar7);
              ::std::__cxx11::string::operator=((string *)psVar7,(string *)&local_278);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar8 = 1;
            err = (string *)(ulong)local_2ec;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b8f19;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"axis");
        if (bVar2) {
          ::std::__cxx11::string::string((string *)&ss_e,"axis",(allocator *)&ret);
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(key_type *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar5 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,local_2e0);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            p_Var6 = local_2d8;
            if ((_Var3) && (uVar1 = *(uint *)((long)&local_2d8[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar7 = local_2e8;
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar4 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xdcd);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar4 = ::std::operator<<(poVar4,"axis");
                poVar4 = ::std::operator<<(poVar4,"` token attribute. Set default token value.");
                ::std::operator<<(poVar4,"\n");
                err = local_2c8;
                if (local_2c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_278,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar7);
                  ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  p_Var6 = local_2d8;
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_2d0->_metas,(AttrMetas *)(p_Var6 + 7));
                ::std::__cxx11::string::string((string *)&ss_e,"axis",(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001b8f28;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            psVar7 = local_2e8;
            _ss_e = AxisEnumHandler;
            ::std::__cxx11::string::string((string *)&ret,"axis",(allocator *)&local_278);
            bVar2 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_228,
                       (function<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar2 = ParseUniformEnumProperty<tinyusdz::Axis,tinyusdz::Axis>
                              ((string *)&ret,bVar2,(EnumHandlerFun<tinyusdz::Axis> *)&local_228,
                               &local_2e0->_attrib,local_2d0,local_2c8,psVar7);
            if (local_218 != (code *)0x0) {
              (*local_218)(&local_228,&local_228,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar8 = 1;
            if (bVar2) {
              AttrMetas::operator=(&local_2d0->_metas,(AttrMetas *)(local_2d8 + 7));
              ::std::__cxx11::string::string((string *)&ret,"axis",(allocator *)&local_278);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar8 = 3;
            }
            ::std::
            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::_M_manager((_Any_data *)&ss_e,(_Any_data *)&ss_e,__destroy_functor);
            goto LAB_001b8f19;
          }
        }
        else {
          err = (string *)&table;
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)err,(key_type *)__lhs);
          if (sVar5 == 0) {
            this = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   ::operator[](&(cylinder->super_GPrim).props,(key_type *)__lhs);
            Property::operator=(this,local_2e0);
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs);
          }
          sVar5 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)err,(key_type *)__lhs);
          if (sVar5 == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xdcf);
            ::std::operator<<(poVar4," ");
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __lhs);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            psVar7 = local_2e8;
            if (local_2e8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_278,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar7);
              ::std::__cxx11::string::operator=((string *)psVar7,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            goto LAB_001b9054;
          }
        }
      }
      else {
LAB_001b8f19:
        if ((iVar8 != 3) && (iVar8 != 0)) break;
      }
LAB_001b8f28:
      p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_2d8);
    }
  }
  else {
LAB_001b9054:
    err = (string *)0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&table._M_t);
  return (bool)(char)err;
}

Assistant:

bool ReconstructPrim<GeomCylinder>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCylinder *cylinder,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, cylinder, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "radius", GeomCylinder,
                         cylinder->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "height", GeomCylinder,
                         cylinder->height)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "axis", Axis, AxisEnumHandler, GeomCylinder, cylinder->axis, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCylinder, cylinder->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}